

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::stopReadInLoop(TcpConnection *this)

{
  Channel *this_00;
  
  EventLoop::assertInLoopThread(this->m_loop);
  this_00 = (this->m_channel)._M_t.
            super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
            _M_t.
            super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
            .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  if ((this->m_reading != false) || ((this_00->m_events & 1) != 0)) {
    Channel::disableReading(this_00);
    this->m_reading = false;
  }
  return;
}

Assistant:

void TcpConnection::stopReadInLoop()
{
	m_loop->assertInLoopThread();
	if (m_reading || m_channel->isReading())
	{
		m_channel->disableReading();
		m_reading = false;
	}
}